

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::udiv(APInt *this,APInt *RHS)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  uint uVar8;
  uint numBits;
  APInt AVar9;
  
  numBits = RHS->BitWidth;
  uVar8 = in_RDX->BitWidth;
  if (numBits != uVar8) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x5fb,"APInt llvm::APInt::udiv(const APInt &) const");
  }
  if (numBits < 0x41) {
    if ((in_RDX->U).VAL == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Divide by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x5ff,"APInt llvm::APInt::udiv(const APInt &) const");
    }
    uVar5 = (RHS->U).VAL / (in_RDX->U).VAL;
  }
  else {
    uVar3 = countLeadingZerosSlowCase(RHS);
    if (uVar8 < 0x41) {
      uVar5 = (in_RDX->U).VAL;
      if (uVar5 == 0) {
        uVar6 = 0x40;
      }
      else {
        lVar1 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar6 = (uint)lVar1 ^ 0x3f;
      }
      uVar6 = (uVar8 - 0x40) + uVar6;
    }
    else {
      uVar6 = countLeadingZerosSlowCase(in_RDX);
    }
    if (uVar8 == uVar6) {
      __assert_fail("rhsWords && \"Divided by zero???\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x607,"APInt llvm::APInt::udiv(const APInt &) const");
    }
    if (numBits != uVar3) {
      if (uVar8 - uVar6 == 1) {
        APInt(this,RHS);
        uVar7 = extraout_RDX_00;
        goto LAB_00146822;
      }
      uVar3 = (uint)((ulong)(numBits - uVar3) + 0x3f >> 6);
      uVar8 = (uint)((ulong)(uVar8 - uVar6) + 0x3f >> 6);
      if ((uVar8 <= uVar3) && (iVar4 = compare(RHS,in_RDX), -1 < iVar4)) {
        bVar2 = operator==(RHS,in_RDX);
        if (bVar2) {
          numBits = RHS->BitWidth;
          uVar5 = 1;
        }
        else {
          numBits = RHS->BitWidth;
          if (uVar3 != 1) {
            APInt(this,numBits,0,false);
            divide((RHS->U).pVal,uVar3,(in_RDX->U).pVal,uVar8,(this->U).pVal,(WordType *)0x0);
            uVar7 = extraout_RDX_01;
            goto LAB_00146822;
          }
          uVar5 = *(RHS->U).pVal / *(in_RDX->U).pVal;
        }
        goto LAB_00146818;
      }
    }
    uVar5 = 0;
  }
LAB_00146818:
  APInt(this,numBits,uVar5,false);
  uVar7 = extraout_RDX;
LAB_00146822:
  AVar9._8_8_ = uVar7;
  AVar9.U.pVal = (uint64_t *)this;
  return AVar9;
}

Assistant:

APInt APInt::udiv(const APInt &RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");

  // First, deal with the easy case
  if (isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Divide by zero?");
    return APInt(BitWidth, U.VAL / RHS.U.VAL);
  }

  // Get some facts about the LHS and RHS number of bits and words
  unsigned lhsWords = getNumWords(getActiveBits());
  unsigned rhsBits  = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Divided by zero???");

  // Deal with some degenerate cases
  if (!lhsWords)
    // 0 / X ===> 0
    return APInt(BitWidth, 0);
  if (rhsBits == 1)
    // X / 1 ===> X
    return *this;
  if (lhsWords < rhsWords || this->ult(RHS))
    // X / Y ===> 0, iff X < Y
    return APInt(BitWidth, 0);
  if (*this == RHS)
    // X / X ===> 1
    return APInt(BitWidth, 1);
  if (lhsWords == 1) // rhsWords is 1 if lhsWords is 1.
    // All high words are zero, just use native divide
    return APInt(BitWidth, this->U.pVal[0] / RHS.U.pVal[0]);

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  APInt Quotient(BitWidth, 0); // to hold result.
  divide(U.pVal, lhsWords, RHS.U.pVal, rhsWords, Quotient.U.pVal, nullptr);
  return Quotient;
}